

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::GenerateBlockSyntax::GenerateBlockSyntax
          (GenerateBlockSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          NamedLabelSyntax *label,Token begin,NamedBlockClauseSyntax *beginName,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token end,NamedBlockClauseSyntax *endName
          )

{
  Token TVar1;
  iterator ppMVar2;
  undefined8 uVar3;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  NamedBlockClauseSyntax *beginName_local;
  NamedLabelSyntax *label_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  GenerateBlockSyntax *this_local;
  Token begin_local;
  
  TVar1 = end;
  uVar3 = begin._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,GenerateBlock,attributes);
  this->label = label;
  (this->begin).kind = (short)uVar3;
  (this->begin).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->begin).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->begin).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->begin).info = begin.info;
  this->beginName = beginName;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(&this->members,members);
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  end.info = TVar1.info;
  (this->end).info = end.info;
  this->endName = endName;
  if (this->label != (NamedLabelSyntax *)0x0) {
    (this->label->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (this->beginName != (NamedBlockClauseSyntax *)0x0) {
    (this->beginName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     (&(this->members).
                       super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  ppMVar2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      (&(this->members).
                        super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  for (; __end2 != ppMVar2; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (this->endName != (NamedBlockClauseSyntax *)0x0) {
    (this->endName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

GenerateBlockSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, NamedLabelSyntax* label, Token begin, NamedBlockClauseSyntax* beginName, const SyntaxList<MemberSyntax>& members, Token end, NamedBlockClauseSyntax* endName) :
        MemberSyntax(SyntaxKind::GenerateBlock, attributes), label(label), begin(begin), beginName(beginName), members(members), end(end), endName(endName) {
        if (this->label) this->label->parent = this;
        if (this->beginName) this->beginName->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->endName) this->endName->parent = this;
    }